

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileOptionsCommand.cxx
# Opt level: O2

bool __thiscall
cmTargetCompileOptionsCommand::HandleDirectContent
          (cmTargetCompileOptionsCommand *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool param_3,bool param_4)

{
  cmListFileBacktrace lfbt;
  string sStack_58;
  cmListFileBacktrace local_38;
  
  cmMakefile::GetBacktrace(&local_38,(this->super_cmTargetPropCommandBase).super_cmCommand.Makefile)
  ;
  (*(this->super_cmTargetPropCommandBase).super_cmCommand._vptr_cmCommand[0xb])
            (&sStack_58,this,content);
  cmTarget::InsertCompileOption(tgt,&sStack_58,&local_38,false);
  std::__cxx11::string::~string((string *)&sStack_58);
  cmListFileBacktrace::~cmListFileBacktrace(&local_38);
  return true;
}

Assistant:

bool cmTargetCompileOptionsCommand::HandleDirectContent(
  cmTarget* tgt, const std::vector<std::string>& content, bool, bool)
{
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
  tgt->InsertCompileOption(this->Join(content), lfbt);
  return true;
}